

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O3

LPCSTR NpyArray::ParseHeaderNPY
                 (FILE *fp,shape_t *shape,size_t *wordSize,char *type,bool *fortranOrder)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  char buffer [32];
  string header;
  char local_78;
  int local_77;
  char local_73;
  char local_72;
  char local_70;
  char local_6f;
  char local_6e;
  byte local_6d;
  bool *local_58;
  string local_50;
  
  sVar1 = fread(&local_78,1,10,(FILE *)fp);
  pcVar3 = "error: invalid header id";
  if (((sVar1 == 10) && (local_78 == -0x6d)) && (local_73 == 'Y' && local_77 == 0x504d554e)) {
    local_58 = fortranOrder;
    if (local_72 < '\x02') {
      sVar1 = (ulong)(ushort)(short)local_70 | (ulong)(((int)local_6f & 0xffffU) << 8);
    }
    else {
      fread(&local_6e,1,2,(FILE *)fp);
      sVar1 = (size_t)((int)local_70 | (int)local_6f << 8 |
                      (int)local_6e << 0x10 | (uint)local_6d << 0x18);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)sVar1);
    sVar2 = fread(local_50._M_dataplus._M_p,1,sVar1,(FILE *)fp);
    if (sVar2 == sVar1) {
      pcVar3 = ParseHeaderNPY(&local_50,shape,wordSize,type,local_58);
    }
    else {
      pcVar3 = "error: invalid header";
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return pcVar3;
}

Assistant:

LPCSTR NpyArray::ParseHeaderNPY(FILE* fp, shape_t& shape, size_t& wordSize, char& type, bool& fortranOrder)
{
	char buffer[32];
	if (fread(buffer, sizeof(char), 10, fp) != 10 ||
		buffer[0] != (char)0x93 || _tcsncmp(buffer+1, "NUMPY", 5) != 0)
		return "error: invalid header id";
	// parse the length of the header data
	uint32_t lenHeader;
	ASSERT(buffer[7] >= 0); // minor version number of the file format
	if (buffer[6] > 1) { // major version number of the file format
		// little-endian unsigned int
		fread(buffer+10, sizeof(char), 2, fp);
		lenHeader = (uint32_t(buffer[11])<<24)|(uint32_t(buffer[10])<<16)|(uint32_t(buffer[9])<<8)|uint32_t(buffer[8]);
	} else {
		// little-endian unsigned short int
		lenHeader = (uint16_t(buffer[9])<<8)|uint16_t(buffer[8]);
	}
	std::string header(lenHeader, '\0');
	if (fread(&header[0], sizeof(char), lenHeader, fp) != lenHeader)
		return "error: invalid header";
	return ParseHeaderNPY(header, shape, wordSize, type, fortranOrder);
}